

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetDataReliablePdu.cpp
# Opt level: O2

void __thiscall DIS::SetDataReliablePdu::marshal(SetDataReliablePdu *this,DataStream *dataStream)

{
  pointer pFVar1;
  pointer pVVar2;
  ulong uVar3;
  long lVar4;
  FixedDatum x;
  
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator<<(dataStream,this->_requiredReliabilityService);
  DataStream::operator<<(dataStream,this->_pad1);
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<
            (dataStream,
             (uint)((ulong)((long)(this->_fixedDatumRecords).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_fixedDatumRecords).
                                 super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (uint)(((long)(this->_variableDatumRecords).
                           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_variableDatumRecords).
                          super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  lVar4 = 8;
  for (uVar3 = 0;
      pFVar1 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_fixedDatumRecords).
                            super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar3 = uVar3 + 1) {
    x._vptr_FixedDatum = (_func_int **)&PTR__FixedDatum_001b10a8;
    x._8_8_ = *(undefined8 *)((long)&pFVar1->_vptr_FixedDatum + lVar4);
    FixedDatum::marshal(&x,dataStream);
    FixedDatum::~FixedDatum(&x);
    lVar4 = lVar4 + 0x10;
  }
  lVar4 = 0;
  for (uVar3 = 0;
      pVVar2 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->_variableDatumRecords).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x30);
      uVar3 = uVar3 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&x,(VariableDatum *)((long)&pVVar2->_vptr_VariableDatum + lVar4));
    VariableDatum::marshal((VariableDatum *)&x,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)&x);
    lVar4 = lVar4 + 0x30;
  }
  return;
}

Assistant:

void SetDataReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    dataStream << _requiredReliabilityService;
    dataStream << _pad1;
    dataStream << _pad2;
    dataStream << _requestID;
    dataStream << ( unsigned int )_fixedDatumRecords.size();
    dataStream << ( unsigned int )_variableDatumRecords.size();

     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        FixedDatum x = _fixedDatumRecords[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        VariableDatum x = _variableDatumRecords[idx];
        x.marshal(dataStream);
     }

}